

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O2

void __thiscall CMU462::Matrix4x4::operator/=(Matrix4x4 *this,double x)

{
  int i;
  long lVar1;
  long lVar2;
  Matrix4x4 *A;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
      *(double *)((long)this + lVar2) = *(double *)((long)this + lVar2) * (1.0 / x);
    }
    this = (Matrix4x4 *)((long)this + 8);
  }
  return;
}

Assistant:

void Matrix4x4::operator/=( double x ) {
    Matrix4x4& A( *this );
    double rx = 1./x;

    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       A( i, j ) *= rx;
    }
  }